

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O2

x86Reg GenCodeLoadInt32FromRegister(CodeGenRegVmContext *ctx,uchar reg,bool readOnly)

{
  bool bVar1;
  x86Reg xVar2;
  uint shift;
  undefined7 in_register_00000031;
  
  shift = (int)CONCAT71(in_register_00000031,reg) * 8;
  xVar2 = CodeGenGenericContext::FindRegAtMemory(&ctx->ctx,sDWORD,rNONE,1,rEBX,shift,true);
  if (((xVar2 != rRegCount) && (bVar1 = CodeGenGenericContext::IsRegLocked(&ctx->ctx,xVar2), !bVar1)
      ) && ((readOnly ||
            (bVar1 = CodeGenGenericContext::IsLastRegVmRegisterUse
                               (&ctx->ctx,reg,
                                ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset), bVar1)
            ))) {
    CodeGenGenericContext::LockReg(&ctx->ctx,xVar2);
    return xVar2;
  }
  xVar2 = CodeGenGenericContext::GetReg(&ctx->ctx);
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,xVar2,sDWORD,rEBX,shift);
  return xVar2;
}

Assistant:

x86Reg GenCodeLoadInt32FromRegister(CodeGenRegVmContext &ctx, unsigned char reg, bool readOnly)
{
	x86Reg lhsReg = ctx.ctx.FindRegAtMemory(sDWORD, rNONE, 1, rREG, reg * 8, true);

	if(lhsReg != rRegCount && !ctx.ctx.IsRegLocked(lhsReg) && (readOnly || ctx.ctx.IsLastRegVmRegisterUse(reg, ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset)))
	{
		ctx.ctx.LockReg(lhsReg);
	}
	else
	{
		lhsReg = ctx.ctx.GetReg();

		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, lhsReg, sDWORD, rREG, reg * 8); // Load lhs
	}

	return lhsReg;
}